

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O2

char * jsonnet_realloc(JsonnetVm *vm,char *str,size_t sz)

{
  char *pcVar1;
  
  if (str == (char *)0x0) {
    if (sz == 0) {
      return (char *)0x0;
    }
    pcVar1 = (char *)malloc(sz);
    str = (char *)sz;
  }
  else {
    if (sz == 0) goto LAB_0015c5c5;
    pcVar1 = (char *)realloc(str,sz);
  }
  if (pcVar1 != (char *)0x0) {
    return pcVar1;
  }
  memory_panic();
LAB_0015c5c5:
  free(str);
  return (char *)0x0;
}

Assistant:

char *jsonnet_realloc(JsonnetVm *vm, char *str, size_t sz)
{
    (void)vm;
    if (str == nullptr) {
        if (sz == 0)
            return nullptr;
        auto *r = static_cast<char *>(::malloc(sz));
        if (r == nullptr)
            memory_panic();
        return r;
    } else {
        if (sz == 0) {
            ::free(str);
            return nullptr;
        } else {
            auto *r = static_cast<char *>(::realloc(str, sz));
            if (r == nullptr)
                memory_panic();
            return r;
        }
    }
}